

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O3

uint __thiscall CVmHashFuncCS::compute_hash(CVmHashFuncCS *this,char *s,size_t l)

{
  uint uVar1;
  size_t sVar2;
  
  if (l != 0) {
    sVar2 = 0;
    uVar1 = 0;
    do {
      uVar1 = uVar1 + (byte)s[sVar2];
      sVar2 = sVar2 + 1;
    } while (l != sVar2);
    return uVar1;
  }
  return 0;
}

Assistant:

unsigned int CVmHashFuncCS::compute_hash(const char *s, size_t l) const
{
    uint acc;

    /*
     *   add up all the character values in the string, treating case as
     *   significant 
     */
    for (acc = 0 ; l != 0 ; ++s, --l)
    {
        uchar c;

        c = (uchar)*s;
        acc += c;
    }

    /* return the accumulated value */
    return acc;
}